

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3Fts5Strndup(int *pRc,char *pIn,int nIn)

{
  size_t sVar1;
  char *__dest;
  
  if (*pRc == 0) {
    if (nIn < 0) {
      sVar1 = strlen(pIn);
      nIn = (int)sVar1;
    }
    __dest = (char *)sqlite3_malloc(nIn + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,pIn,(long)nIn);
      __dest[nIn] = '\0';
      return __dest;
    }
    *pRc = 7;
  }
  return (char *)0x0;
}

Assistant:

static char *sqlite3Fts5Strndup(int *pRc, const char *pIn, int nIn){
  char *zRet = 0;
  if( *pRc==SQLITE_OK ){
    if( nIn<0 ){
      nIn = (int)strlen(pIn);
    }
    zRet = (char*)sqlite3_malloc(nIn+1);
    if( zRet ){
      memcpy(zRet, pIn, nIn);
      zRet[nIn] = '\0';
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
  return zRet;
}